

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O0

size_t utf8::DecodeUnitsInto
                 (char16 *buffer,LPCUTF8 *pbUtf8,LPCUTF8 pbEnd,DecodeOptions options,
                 bool *chunkEndsAtTruncatedSequence)

{
  uint uVar1;
  char16 *pcVar2;
  bool bVar3;
  char16 cVar4;
  LPCOLESTR pch;
  char16 chDest;
  LPCUTF8 s;
  char16 *pcStack_48;
  uint bytes;
  char16 *dest;
  LPCUTF8 p;
  bool *pbStack_30;
  DecodeOptions localOptions;
  bool *chunkEndsAtTruncatedSequence_local;
  char16 *pcStack_20;
  DecodeOptions options_local;
  LPCUTF8 pbEnd_local;
  LPCUTF8 *pbUtf8_local;
  char16 *buffer_local;
  
  if (chunkEndsAtTruncatedSequence != (bool *)0x0) {
    *chunkEndsAtTruncatedSequence = false;
  }
  dest = (char16 *)*pbUtf8;
  p._4_4_ = options;
  pbStack_30 = chunkEndsAtTruncatedSequence;
  chunkEndsAtTruncatedSequence_local._4_4_ = options;
  pcStack_20 = (char16 *)pbEnd;
  pbEnd_local = (LPCUTF8)pbUtf8;
  pbUtf8_local = (LPCUTF8 *)buffer;
  bVar3 = ShouldFastPath((LPCUTF8)dest,buffer);
  pcStack_48 = buffer;
  if (bVar3) goto LAB_0018755c;
  while ((pcVar2 = dest, dest < pcStack_20 &&
         (cVar4 = Decode((LPCUTF8 *)&dest,(LPCUTF8)pcStack_20,(DecodeOptions *)((long)&p + 4),
                         pbStack_30), pcVar2 < dest))) {
    pch = pcStack_48 + 1;
    *pcStack_48 = cVar4;
    bVar3 = ShouldFastPath((LPCUTF8)dest,pch);
    pcStack_48 = pch;
    if (bVar3) {
LAB_0018755c:
      for (; ((char16 *)((long)dest + 3U) < pcStack_20 &&
             (uVar1 = *(uint *)dest, (uVar1 & 0x80808080) == 0)); dest = dest + 2) {
        *(uint *)pcStack_48 = uVar1 & 0xff | (uVar1 & 0xff00) << 8;
        *(uint *)(pcStack_48 + 2) = uVar1 >> 0x10 & 0xff | (uVar1 >> 0x10 & 0xff00) << 8;
        pcStack_48 = pcStack_48 + 4;
      }
    }
  }
  *(char16 **)pbEnd_local = dest;
  return (long)pcStack_48 - (long)pbUtf8_local >> 1;
}

Assistant:

_Use_decl_annotations_
    size_t DecodeUnitsInto(char16 *buffer, LPCUTF8& pbUtf8, LPCUTF8 pbEnd, DecodeOptions options, bool *chunkEndsAtTruncatedSequence)
    {
        DecodeOptions localOptions = options;

        if (chunkEndsAtTruncatedSequence)
        {
            *chunkEndsAtTruncatedSequence = false;
        }

        LPCUTF8 p = pbUtf8;
        char16 *dest = buffer;

        if (!ShouldFastPath(p, dest)) goto LSlowPath;

LFastPath:
        while (p + 3 < pbEnd)
        {
            unsigned bytes = *(unsigned *)p;
            if ((bytes & 0x80808080) != 0) goto LSlowPath;
            ((uint32 *)dest)[0] = (char16(bytes) & 0x00FF) | ((char16(bytes) & 0xFF00) << 8);
            ((uint32 *)dest)[1] = (char16(bytes >> 16) & 0x00FF) | ((char16(bytes >> 16) & 0xFF00) << 8);
            p += 4;
            dest += 4;
        }

LSlowPath:
        while (p < pbEnd)
        {
            LPCUTF8 s = p;
            char16 chDest = Decode(p, pbEnd, localOptions, chunkEndsAtTruncatedSequence);

            if (s < p)
            {
                // We decoded the character, store it
                *dest++ = chDest;
            }
            else
            {
                // Nothing was converted. This might happen at the end of a buffer with doChunkedEncoding.
                break;
            }

            if (ShouldFastPath(p, dest)) goto LFastPath;
        }

        pbUtf8 = p;

        return dest - buffer;
    }